

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O0

void __thiscall IntVar::specialiseToLL(IntVar *this)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  long *in_RDI;
  IntVar *in_stack_00000368;
  IntVarLL *in_stack_00000370;
  char *local_28;
  
  iVar1 = (**(code **)(*in_RDI + 0x18))();
  __stream = _stderr;
  if (iVar1 == 1) {
    IntVarLL::IntVarLL(in_stack_00000370,in_stack_00000368);
  }
  else if ((iVar1 != 2) && (iVar1 != 4)) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
      ;
    }
    else {
      local_28 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                         ,0x2f);
      local_28 = local_28 + 1;
    }
    fprintf(__stream,"%s:%d: ",local_28,0x65);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  return;
}

Assistant:

void IntVar::specialiseToLL() {
	switch (getType()) {
		case INT_VAR_EL:
		case INT_VAR_SL:
			return;
		case INT_VAR:
			new (this) IntVarLL(*((IntVar*)this));
			break;
		default:
			NEVER;
	}
}